

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_escaped_cp<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,find_escape_result<char> *escape)

{
  char *pcVar1;
  basic_appender<char> bVar2;
  make_unsigned_t<long> mVar3;
  uint cp;
  make_unsigned_t<long> mVar4;
  basic_appender<char> local_30;
  
  cp = escape->cp;
  local_30.container = out.container;
  if (cp == 9) {
    basic_appender<char>::operator=(&local_30,'\\');
    cp = 0x74;
    goto LAB_001b4080;
  }
  if (cp != 0x5c) {
    if (cp == 0xd) {
      basic_appender<char>::operator=(&local_30,'\\');
      cp = 0x72;
      goto LAB_001b4080;
    }
    if ((cp != 0x22) && (cp != 0x27)) {
      if (cp != 10) {
        if (cp < 0x100) {
          bVar2 = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>(out,'x',cp);
          return (basic_appender<char>)bVar2.container;
        }
        if (0xffff < cp) {
          if (0x10ffff < cp) {
            pcVar1 = escape->begin;
            mVar3 = to_unsigned<long>((long)escape->end - (long)pcVar1);
            for (mVar4 = 0; mVar3 != mVar4; mVar4 = mVar4 + 1) {
              out = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>
                              (out,'x',(uint)(byte)pcVar1[mVar4]);
            }
            return (basic_appender<char>)out.container;
          }
          bVar2 = write_codepoint<8ul,char,fmt::v11::basic_appender<char>>(out,'U',cp);
          return (basic_appender<char>)bVar2.container;
        }
        bVar2 = write_codepoint<4ul,char,fmt::v11::basic_appender<char>>(out,'u',cp);
        return (basic_appender<char>)bVar2.container;
      }
      basic_appender<char>::operator=(&local_30,'\\');
      cp = 0x6e;
      goto LAB_001b4080;
    }
  }
  basic_appender<char>::operator=(&local_30,'\\');
LAB_001b4080:
  local_30.container = out.container;
  basic_appender<char>::operator=(&local_30,(char)cp);
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':  FMT_FALLTHROUGH;
  case '\'': FMT_FALLTHROUGH;
  case '\\': *out++ = static_cast<Char>('\\'); break;
  default:
    if (escape.cp < 0x100) return write_codepoint<2, Char>(out, 'x', escape.cp);
    if (escape.cp < 0x10000)
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    if (escape.cp < 0x110000)
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}